

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<DomGradientStop_*>::relocate
          (QArrayDataPointer<DomGradientStop_*> *this,qsizetype offset,DomGradientStop ***data)

{
  DomGradientStop **d_first;
  DomGradientStop **ppDVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<DomGradientStop*,long_long>(this->ptr,this->size,d_first);
  if (data != (DomGradientStop ***)0x0) {
    ppDVar1 = *data;
    if ((this->ptr <= ppDVar1) && (ppDVar1 < this->ptr + this->size)) {
      *data = ppDVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }